

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RegexPattern::split
          (RegexPattern *this,UnicodeString *input,UnicodeString *dest,int32_t destCapacity,
          UErrorCode *status)

{
  UBool UVar1;
  int32_t local_184;
  undefined1 local_180 [4];
  int32_t r;
  RegexMatcher m;
  UErrorCode *status_local;
  int32_t destCapacity_local;
  UnicodeString *dest_local;
  UnicodeString *input_local;
  RegexPattern *this_local;
  
  m.fWordBreakItr = (RuleBasedBreakIterator *)status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    RegexMatcher::RegexMatcher((RegexMatcher *)local_180,this);
    local_184 = 0;
    UVar1 = ::U_SUCCESS(m.fFindProgressCallbackContext._4_4_);
    if (UVar1 != '\0') {
      local_184 = RegexMatcher::split((RegexMatcher *)local_180,input,dest,destCapacity,
                                      (UErrorCode *)m.fWordBreakItr);
    }
    this_local._4_4_ = local_184;
    RegexMatcher::~RegexMatcher((RegexMatcher *)local_180);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t  RegexPattern::split(const UnicodeString &input,
        UnicodeString    dest[],
        int32_t          destCapacity,
        UErrorCode      &status) const
{
    if (U_FAILURE(status)) {
        return 0;
    };

    RegexMatcher  m(this);
    int32_t r = 0;
    // Check m's status to make sure all is ok.
    if (U_SUCCESS(m.fDeferredStatus)) {
    	r = m.split(input, dest, destCapacity, status);
    }
    return r;
}